

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O3

bool __thiscall CppJieba::Trie::_insert(Trie *this,TrieNodeInfo *nodeInfo)

{
  bool bVar1;
  pointer puVar2;
  iterator iVar3;
  mapped_type *ppTVar4;
  mapped_type pTVar5;
  ulong uVar6;
  ulong uVar7;
  mapped_type this_00;
  uint16_t cu;
  string local_50;
  
  if (this->_initFlag == false) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"not initted!","");
    Limonp::Logger::LoggingF(4,"Trie.hpp",0x108,&local_50);
  }
  else {
    pTVar5 = this->_root;
    puVar2 = (nodeInfo->word).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((nodeInfo->word).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
        .super__Vector_impl_data._M_finish != puVar2) {
      uVar6 = 0;
      uVar7 = 1;
      this_00 = pTVar5;
      do {
        local_50._M_dataplus._M_p._0_2_ = puVar2[uVar6];
        if (this_00 == (mapped_type)0x0) {
          return false;
        }
        iVar3 = std::
                _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this_00,(key_type *)&local_50);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false>.
            _M_cur == (__node_type *)0x0) {
          pTVar5 = (mapped_type)operator_new(0x40);
          (pTVar5->hmap)._M_h._M_buckets = &(pTVar5->hmap)._M_h._M_single_bucket;
          (pTVar5->hmap)._M_h._M_bucket_count = 1;
          (pTVar5->hmap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pTVar5->hmap)._M_h._M_element_count = 0;
          (pTVar5->hmap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          pTVar5->nodeInfoVecPos = 0;
          (pTVar5->hmap)._M_h._M_rehash_policy._M_next_resize = 0;
          (pTVar5->hmap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          pTVar5->isLeaf = false;
          ppTVar4 = std::__detail::
                    _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_50);
          *ppTVar4 = pTVar5;
        }
        else {
          ppTVar4 = std::__detail::
                    _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_50);
          pTVar5 = *ppTVar4;
        }
        puVar2 = (nodeInfo->word).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar1 = uVar7 < (ulong)((long)(nodeInfo->word).
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 1
                               );
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
        this_00 = pTVar5;
      } while (bVar1);
    }
    if (pTVar5 == (mapped_type)0x0) {
      return false;
    }
    if (pTVar5->isLeaf != true) {
      pTVar5->isLeaf = true;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (&this->_nodeInfoVec,nodeInfo);
      pTVar5->nodeInfoVecPos =
           (int)((ulong)((long)(this->_nodeInfoVec).
                               super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_nodeInfoVec).
                              super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 - 1;
      return true;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"this node already _inserted","");
    Limonp::Logger::LoggingF(3,"Trie.hpp",0x12f,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool _insert(const TrieNodeInfo& nodeInfo)
            {
                if(!_getInitFlag())
                {
                    LogFatal("not initted!");
                    return false;
                }


                const Unicode& uintVec = nodeInfo.word;
                TrieNode* p = _root;
                for(uint i = 0; i < uintVec.size(); i++)
                {
                    uint16_t cu = uintVec[i];
                    if(NULL == p)
                    {
                        return false;
                    }
                    if(p->hmap.end() == p->hmap.find(cu))
                    {
                        TrieNode * next = NULL;
                        try
                        {
                            next = new TrieNode;
                        }
                        catch(const bad_alloc& e)
                        {
                            return false;
                        }
                        p->hmap[cu] = next;
                        p = next;
                    }
                    else
                    {
                        p = p->hmap[cu];
                    }
                }
                if(NULL == p)
                {
                    return false;
                }
                if(p->isLeaf)
                {
                    LogError("this node already _inserted");
                    return false;
                }

                p->isLeaf = true;
                _nodeInfoVec.push_back(nodeInfo);
                p->nodeInfoVecPos = _nodeInfoVec.size() - 1;

                return true;
            }